

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

QCalendarWidget * __thiscall QCalendarPopup::verifyCalendarInstance(QCalendarPopup *this)

{
  long lVar1;
  bool bVar2;
  QCalendarWidget *this_00;
  QCalendarWidget *in_RDI;
  long in_FS_OFFSET;
  QCalendarWidget *cw;
  QWidget *in_stack_00000100;
  QCalendarWidget *in_stack_00000108;
  QCalendarWidget *pQVar3;
  QCalendar in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QPointer<QCalendarWidget>::isNull((QPointer<QCalendarWidget> *)0x56249e);
  if (bVar2) {
    this_00 = (QCalendarWidget *)operator_new(0x28);
    QCalendarWidget::QCalendarWidget(in_stack_00000108,in_stack_00000100);
    pQVar3 = this_00;
    QCalendarWidget::setCalendar(this_00,in_stack_ffffffffffffffe8);
    QCalendarWidget::setVerticalHeaderFormat(in_RDI,(VerticalHeaderFormat)((ulong)pQVar3 >> 0x20));
    setCalendarWidget(this,cw);
  }
  else {
    this_00 = QPointer<QCalendarWidget>::data((QPointer<QCalendarWidget> *)0x56251c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QCalendarWidget *QCalendarPopup::verifyCalendarInstance()
{
    if (calendar.isNull()) {
        QCalendarWidget *cw = new QCalendarWidget(this);
        cw->setCalendar(calendarSystem);
        cw->setVerticalHeaderFormat(QCalendarWidget::NoVerticalHeader);
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled())
            cw->setHorizontalHeaderFormat(QCalendarWidget::SingleLetterDayNames);
#endif
        setCalendarWidget(cw);
        return cw;
    } else {
        return calendar.data();
    }
}